

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibraryLinux.cpp
# Opt level: O0

void __thiscall Diligent::DXCompilerLibrary::Load(DXCompilerLibrary *this)

{
  ulong uVar1;
  undefined8 uVar2;
  void *pvVar3;
  DxcCreateInstanceProc local_20;
  DXCompilerLibrary *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar2 = std::__cxx11::string::c_str();
    pvVar3 = (void *)dlopen(uVar2,1);
    this->m_Library = pvVar3;
  }
  if (this->m_Library == (void *)0x0) {
    pvVar3 = (void *)dlopen("libdxcompiler.so",1);
    this->m_Library = pvVar3;
  }
  if (this->m_Library == (void *)0x0) {
    pvVar3 = (void *)dlopen("/usr/lib/dxc/libdxcompiler.so",1);
    this->m_Library = pvVar3;
  }
  if (this->m_Library == (void *)0x0) {
    local_20 = (DxcCreateInstanceProc)0x0;
  }
  else {
    local_20 = (DxcCreateInstanceProc)dlsym(this->m_Library,"DxcCreateInstance");
  }
  this->m_DxcCreateInstance = local_20;
  return;
}

Assistant:

void DXCompilerLibrary::Load()
{
    if (!m_LibName.empty())
        m_Library = dlopen(m_LibName.c_str(), RTLD_LOCAL | RTLD_LAZY);

    if (m_Library == nullptr)
        m_Library = dlopen("libdxcompiler.so", RTLD_LOCAL | RTLD_LAZY);

    // try to load from default path
    if (m_Library == nullptr)
        m_Library = dlopen("/usr/lib/dxc/libdxcompiler.so", RTLD_LOCAL | RTLD_LAZY);

    m_DxcCreateInstance = m_Library != nullptr ? reinterpret_cast<DxcCreateInstanceProc>(dlsym(m_Library, "DxcCreateInstance")) : nullptr;
}